

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

void __thiscall QThreadPool::setExpiryTimeout(QThreadPool *this,int expiryTimeout)

{
  qsizetype *this_00;
  qsizetype *pqVar1;
  long lVar2;
  void *copy;
  QObjectData *pQVar3;
  int iVar4;
  
  pQVar3 = (this->super_QObject).d_ptr.d;
  this_00 = &pQVar3[1].children.d.size;
  if (pQVar3[1].children.d.size == 0) {
    LOCK();
    lVar2 = *this_00;
    if (lVar2 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar2 == 0) goto LAB_003d45cb;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_003d45cb:
  iVar4 = 0x7fffffff;
  if ((uint)expiryTimeout < 0x7fffffff) {
    iVar4 = expiryTimeout;
  }
  *(int *)&pQVar3[3]._vptr_QObjectData = iVar4;
  LOCK();
  pqVar1 = &pQVar3[1].children.d.size;
  copy = (void *)*pqVar1;
  *pqVar1 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    return;
  }
  return;
}

Assistant:

void QThreadPool::setExpiryTimeout(int expiryTimeout)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (expiryTimeout < 0)
        d->expiryTimeout = decltype(d->expiryTimeout)::max();
    else
        d->expiryTimeout = expiryTimeout * 1ms;
}